

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void gimage::imageSelect<unsigned_char,gimage::PixelTraits<unsigned_char>>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *ret,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,int j)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (ret,image->width,image->height,1);
  lVar2 = image->height;
  if (0 < lVar2) {
    lVar3 = image->width;
    lVar1 = 0;
    do {
      if (0 < lVar3) {
        lVar2 = 0;
        do {
          (*ret->img)[lVar1][lVar2] = image->img[j][lVar1][lVar2];
          lVar2 = lVar2 + 1;
          lVar3 = image->width;
        } while (lVar2 < lVar3);
        lVar2 = image->height;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < lVar2);
  }
  return;
}

Assistant:

void imageSelect(Image<T, traits> &ret, const Image<T, traits> &image, int j)
{
  ret.setSize(image.getWidth(), image.getHeight(), 1);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      ret.set(i, k, 0, image.get(i, k, j));
    }
  }
}